

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

string * __thiscall
cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_
          (string *__return_storage_ptr__,AddressFormatData *this)

{
  const_iterator cVar1;
  allocator local_41;
  key_type local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"bech32",&local_41);
  cVar1 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->map_)._M_t._M_impl.super__Rb_tree_header) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_40);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_40,"bech32",&local_41);
    GetString(__return_storage_ptr__,this,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AddressFormatData::GetBech32Hrp() const {
  if (map_.find(kPrefixBech32Hrp) == map_.end()) {
    return "";
  }
  return GetString(kPrefixBech32Hrp);
}